

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
::ExportConStatus(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                  *this,int i_con,Container *cnt,ItemNamer *vnam,bool add2final)

{
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar1;
  BasicLogger *pBVar2;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  int i_con_local;
  char *local_488;
  MemoryWriter pr;
  MemoryWriter wrt;
  
  i_con_local = i_con;
  pBVar2 = BasicConstraintKeeper::GetLogger(&this->super_BasicConstraintKeeper);
  if (pBVar2 != (BasicLogger *)0x0) {
    wrt.super_BasicWriter<char>.buffer_ = &wrt.buffer_.super_Buffer<char>;
    wrt.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_004bb5f8;
    wrt.buffer_.super_Buffer<char>.ptr_ = wrt.buffer_.data_;
    wrt.buffer_.super_Buffer<char>.size_ = 0;
    wrt.buffer_.super_Buffer<char>.capacity_ = 500;
    wrt.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004bb640;
    jw.wrt_ = &wrt;
    jw.kind_ = Unset;
    jw.n_written_ = 0;
    local_4b0.wrt_ =
         (BasicMemoryWriter<char,_std::allocator<char>_> *)
         BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
    key._M_str = (char *)0x8;
    key._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr,key);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&pr,
               (char **)&local_4b0);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr);
    key_00._M_str = (char *)0x5;
    key_00._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr,key_00);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&pr,&i_con_local
              );
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr);
    pBVar1 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
             (cnt->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
    if (*(char *)&pBVar1->super_BasicWriter<char> != '\0') {
      key_01._M_str = (char *)0x4;
      key_01._M_len = (size_t)&jw;
      local_4b0.wrt_ = pBVar1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr,key_01)
      ;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&pr,
                 (char **)&local_4b0);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr);
      pr.super_BasicWriter<char>.buffer_ = &pr.buffer_.super_Buffer<char>;
      pr.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_004bb5f8;
      pr.buffer_.super_Buffer<char>.ptr_ = pr.buffer_.data_;
      pr.buffer_.super_Buffer<char>.size_ = 0;
      pr.buffer_.super_Buffer<char>.capacity_ = 500;
      pr.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004bb640;
      WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                (&pr,(AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)cnt,vnam);
      local_488 = fmt::BasicWriter<char>::c_str(&pr.super_BasicWriter<char>);
      key_02._M_str = (char *)0x7;
      key_02._M_len = (size_t)&jw;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4b0,key_02);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_4b0,
                 &local_488);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                (&local_4b0);
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&pr);
    }
    key_03._M_str = (char *)0x5;
    key_03._M_len = (size_t)&jw;
    local_4b0.wrt_._0_4_ = cnt->depth_;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr,key_03);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&pr,
               (int *)&local_4b0);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr);
    local_4b0.wrt_._0_4_ = (uint)(cnt->is_unused_ != '\0');
    key_04._M_str = (char *)0x6;
    key_04._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr,key_04);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&pr,
               (int *)&local_4b0);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr);
    local_4b0.wrt_._0_4_ = (uint)(cnt->is_bridged_ != '\0');
    key_05._M_str = (char *)0x7;
    key_05._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr,key_05);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&pr,
               (int *)&local_4b0);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr);
    local_4b0.wrt_ =
         (BasicMemoryWriter<char,_std::allocator<char>_> *)
         CONCAT44(local_4b0.wrt_._4_4_,(uint)add2final);
    key_06._M_str = (char *)0x5;
    key_06._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr,key_06);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&pr,
               (int *)&local_4b0);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)&pr);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&jw);
    fmt::BasicWriter<char>::write<>(&wrt.super_BasicWriter<char>,(BasicCStringRef<char>)0x37fbf3);
    pBVar2 = BasicConstraintKeeper::GetLogger(&this->super_BasicConstraintKeeper);
    BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar2,&wrt);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&wrt);
  }
  return;
}

Assistant:

void ExportConStatus(int i_con, const Container& cnt,
                       ItemNamer& vnam, bool add2final) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["index"] = i_con;
        if (*cnt.GetCon().name()) {
          jw["name"] = cnt.GetCon().name();
          {
            fmt::MemoryWriter pr;
            WriteFlatCon(pr, cnt.GetCon(), vnam);
            jw["printed"] = pr.c_str();
          }
        }
        jw["depth"] = cnt.GetDepth();
        jw["unused"] = (int)cnt.IsUnused();
        jw["bridged"] = (int)cnt.IsBridged();
        jw["final"] = (int)add2final;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }